

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::constantValueCheck(TParseContext *this,TIntermTyped *node,char *token)

{
  ulong uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
  uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar2) + 8);
  if ((uVar1 & 0x100000000) != 0 || (uVar1 & 0x10000007f) == 2) {
    return;
  }
  iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)
            (this,CONCAT44(extraout_var_00,iVar2),"constant expression required",token,"",
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::constantValueCheck(TIntermTyped* node, const char* token)
{
    if (! node->getQualifier().isConstant())
        error(node->getLoc(), "constant expression required", token, "");
}